

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O3

void JsUtil::
     QuickSort<Memory::_no_write_barrier_policy,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp:311:42)>
     ::Sort(undefined1 (*base) [16],ulong nmemb)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int iVar6;
  char16_t *pcVar7;
  char16_t *string1;
  ulong uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  if (base == (undefined1 (*) [16])0x0) {
    return;
  }
  while (9 < nmemb) {
    uVar11 = nmemb * 2 & 0xfffffffffffffff8;
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + uVar11),*(char16_t **)*base);
    if ((uVar11 != 0) && (iVar6 < 0)) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)(*base + uVar11);
      *(undefined8 *)(*base + uVar11) = uVar5;
    }
    lVar1 = nmemb * 8;
    uVar2 = lVar1 - 8;
    uVar9 = nmemb * 6 & 0xfffffffffffffff8;
    iVar6 = PAL_wcscmp(*(char16_t **)(base[-1] + nmemb * 8 + 8),*(char16_t **)(*base + uVar9));
    if ((uVar9 == uVar2) || (-1 < iVar6)) {
      pcVar7 = *(char16_t **)(base[-1] + lVar1 + 8);
    }
    else {
      pcVar7 = *(char16_t **)(*base + uVar9);
      *(undefined8 *)(*base + uVar9) = *(undefined8 *)(base[-1] + lVar1 + 8);
      *(char16_t **)(base[-1] + lVar1 + 8) = pcVar7;
    }
    uVar8 = nmemb * 4 & 0xfffffffffffffff8;
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)(*base + uVar8));
    if ((uVar8 != uVar2) && (iVar6 < 0)) {
      uVar5 = *(undefined8 *)(*base + uVar8);
      *(undefined8 *)(*base + uVar8) = *(undefined8 *)(base[-1] + lVar1 + 8);
      *(undefined8 *)(base[-1] + lVar1 + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + uVar9),*(char16_t **)(*base + uVar8));
    if ((uVar8 == uVar9) || (-1 < iVar6)) {
      pcVar7 = *(char16_t **)(*base + uVar9);
    }
    else {
      pcVar7 = *(char16_t **)(*base + uVar8);
      *(undefined8 *)(*base + uVar8) = *(undefined8 *)(*base + uVar9);
      *(char16_t **)(*base + uVar9) = pcVar7;
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if ((uVar9 != 0) && (iVar6 < 0)) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)(*base + uVar9);
      *(undefined8 *)(*base + uVar9) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + uVar8),*(char16_t **)*base);
    if ((uVar8 != 0) && (iVar6 < 0)) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)(*base + uVar8);
      *(undefined8 *)(*base + uVar8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[-1] + lVar1 + 8),*(char16_t **)(*base + uVar11));
    if ((uVar11 != uVar2) && (iVar6 < 0)) {
      uVar5 = *(undefined8 *)(*base + uVar11);
      *(undefined8 *)(*base + uVar11) = *(undefined8 *)(base[-1] + lVar1 + 8);
      *(undefined8 *)(base[-1] + lVar1 + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + uVar9),*(char16_t **)(*base + uVar11));
    if ((uVar11 != uVar9) && (iVar6 < 0)) {
      uVar5 = *(undefined8 *)(*base + uVar11);
      *(undefined8 *)(*base + uVar11) = *(undefined8 *)(*base + uVar9);
      *(undefined8 *)(*base + uVar9) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + uVar8),*(char16_t **)(*base + uVar11));
    if ((uVar11 != uVar8) && (iVar6 < 0)) {
      uVar5 = *(undefined8 *)(*base + uVar11);
      *(undefined8 *)(*base + uVar11) = *(undefined8 *)(*base + uVar8);
      *(undefined8 *)(*base + uVar8) = uVar5;
    }
    if (uVar8 != uVar2) {
      uVar5 = *(undefined8 *)(base[-1] + lVar1 + 8);
      *(undefined8 *)(base[-1] + lVar1 + 8) = *(undefined8 *)(*base + uVar8);
      *(undefined8 *)(*base + uVar8) = uVar5;
    }
    if (uVar8 == 0) {
      lVar12 = 0;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      lVar12 = 0;
      do {
        iVar6 = PAL_wcscmp(*(char16_t **)(*base + uVar11),*(char16_t **)(base[-1] + lVar1 + 8));
        if (iVar6 < 1) {
          uVar9 = lVar12 * 8;
          if (uVar11 != uVar9) {
            uVar5 = *(undefined8 *)(*base + uVar11);
            *(undefined8 *)(*base + uVar11) = *(undefined8 *)(*base + uVar9);
            *(undefined8 *)(*base + uVar9) = uVar5;
          }
          lVar12 = lVar12 + 1;
        }
        uVar11 = uVar11 + 8;
      } while (uVar11 < uVar8);
    }
    for (; uVar11 < uVar2; uVar11 = uVar11 + 8) {
      iVar6 = PAL_wcscmp(*(char16_t **)(*base + uVar11),*(char16_t **)(base[-1] + lVar1 + 8));
      if (iVar6 < 0) {
        uVar9 = lVar12 * 8;
        if (uVar11 != uVar9) {
          uVar5 = *(undefined8 *)(*base + uVar11);
          *(undefined8 *)(*base + uVar11) = *(undefined8 *)(*base + uVar9);
          *(undefined8 *)(*base + uVar9) = uVar5;
        }
        lVar12 = lVar12 + 1;
      }
    }
    lVar3 = lVar12 * 8;
    if (lVar3 - uVar2 != 0) {
      uVar5 = *(undefined8 *)(*base + lVar3);
      *(undefined8 *)(*base + lVar3) = *(undefined8 *)(base[-1] + lVar1 + 8);
      *(undefined8 *)(base[-1] + lVar1 + 8) = uVar5;
    }
    Sort(base,lVar12);
    nmemb = nmemb - (lVar12 + 1);
    base = (undefined1 (*) [16])(*base + lVar12 * 8 + 8);
    if (base == (undefined1 (*) [16])0x0) {
      return;
    }
  }
  switch(nmemb) {
  case 2:
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),*(char16_t **)*base);
    if (-1 < iVar6) {
      return;
    }
    pauVar10 = (undefined1 (*) [16])(*base + 8);
    goto LAB_00366694;
  case 3:
    pauVar10 = (undefined1 (*) [16])(*base + 8);
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),*(char16_t **)*base);
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)*base;
      *(undefined8 *)*base = *(undefined8 *)(*base + 8);
      *(char16_t **)(*base + 8) = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar10;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[1],pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      pcVar7 = *(char16_t **)base[1];
      *(char16_t **)(*base + 8) = pcVar7;
      *(undefined8 *)base[1] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar10;
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    goto LAB_00366690;
  case 4:
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),*(char16_t **)*base);
    if (iVar6 < 0) {
      auVar4 = *base;
      auVar14._0_8_ = auVar4._8_8_;
      auVar14._8_4_ = auVar4._0_4_;
      auVar14._12_4_ = auVar4._4_4_;
      *base = auVar14;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      pcVar7 = *(char16_t **)(base[1] + 8);
      *(char16_t **)base[1] = pcVar7;
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[1];
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)base[1];
      *(undefined8 *)base[1] = uVar5;
    }
    pcVar7 = *(char16_t **)(*base + 8);
    break;
  case 5:
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),*(char16_t **)*base);
    if (iVar6 < 0) {
      auVar4 = *base;
      auVar15._0_8_ = auVar4._8_8_;
      auVar15._8_4_ = auVar4._0_4_;
      auVar15._12_4_ = auVar4._4_4_;
      *base = auVar15;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)(base[1] + 8));
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)(base[1] + 8);
      *(undefined8 *)(base[1] + 8) = *(undefined8 *)base[2];
      *(char16_t **)base[2] = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)base[2];
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      pcVar7 = *(char16_t **)base[2];
      *(char16_t **)base[1] = pcVar7;
      *(undefined8 *)base[2] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[1];
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),pcVar7);
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)base[1];
      *(undefined8 *)base[1] = *(undefined8 *)(base[1] + 8);
      *(char16_t **)(base[1] + 8) = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)(base[1] + 8);
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      pcVar7 = *(char16_t **)(base[1] + 8);
      *(char16_t **)*base = pcVar7;
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*base;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[1],pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)base[1];
      *(undefined8 *)base[1] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      pcVar7 = *(char16_t **)base[2];
      *(char16_t **)(*base + 8) = pcVar7;
      *(undefined8 *)base[2] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)(*base + 8);
    }
    break;
  case 6:
    pauVar13 = base + 1;
    iVar6 = PAL_wcscmp(*(char16_t **)base[1],*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)base[1];
      *(char16_t **)base[1] = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar13;
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      pcVar7 = *(char16_t **)base[1];
      *(char16_t **)*base = pcVar7;
      *(undefined8 *)base[1] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*base;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),pcVar7);
    if (iVar6 < 0) {
      auVar4 = *base;
      auVar26._0_8_ = auVar4._8_8_;
      auVar26._8_4_ = auVar4._0_4_;
      auVar26._12_4_ = auVar4._4_4_;
      *base = auVar26;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),*(char16_t **)base[2]);
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)base[2];
      *(undefined8 *)base[2] = *(undefined8 *)(base[2] + 8);
      *(char16_t **)(base[2] + 8) = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)(base[2] + 8);
    }
    pauVar10 = (undefined1 (*) [16])(base[1] + 8);
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)(base[1] + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[1] + 8);
      pcVar7 = *(char16_t **)(base[2] + 8);
      *(char16_t **)(base[1] + 8) = pcVar7;
      *(undefined8 *)(base[2] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar10;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[1] + 8);
      pcVar7 = *(char16_t **)base[2];
      *(char16_t **)(base[1] + 8) = pcVar7;
      *(undefined8 *)base[2] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar10;
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)(base[1] + 8);
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)base[2];
      *(undefined8 *)base[2] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      pcVar7 = *(char16_t **)(base[2] + 8);
      *(char16_t **)base[1] = pcVar7;
      *(undefined8 *)(base[2] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar13;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      *(undefined8 *)base[1] = *(undefined8 *)base[2];
      *(undefined8 *)base[2] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),*(char16_t **)(*base + 8));
    if (-1 < iVar6) goto LAB_00366246;
    string1 = *(char16_t **)(*base + 8);
    *(undefined8 *)(*base + 8) = *(undefined8 *)(base[1] + 8);
    *(char16_t **)(base[1] + 8) = string1;
    goto LAB_00366249;
  case 7:
    pauVar13 = base + 1;
    iVar6 = PAL_wcscmp(*(char16_t **)base[1],*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)base[1];
      *(char16_t **)base[1] = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar13;
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      pcVar7 = *(char16_t **)base[1];
      *(char16_t **)*base = pcVar7;
      *(undefined8 *)base[1] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*base;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),pcVar7);
    if (iVar6 < 0) {
      auVar4 = *base;
      auVar28._0_8_ = auVar4._8_8_;
      auVar28._8_4_ = auVar4._0_4_;
      auVar28._12_4_ = auVar4._4_4_;
      *base = auVar28;
    }
    pauVar10 = (undefined1 (*) [16])(base[1] + 8);
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)(base[1] + 8));
    if (iVar6 < 0) {
      auVar4 = *pauVar10;
      auVar29._0_8_ = auVar4._8_8_;
      auVar29._8_4_ = auVar4._0_4_;
      auVar29._12_4_ = auVar4._4_4_;
      *pauVar10 = auVar29;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[3],*(char16_t **)(base[2] + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[2] + 8);
      pcVar7 = *(char16_t **)base[3];
      *(char16_t **)(base[2] + 8) = pcVar7;
      *(undefined8 *)base[3] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)(base[2] + 8);
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*pauVar10);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[1] + 8);
      *(undefined8 *)(base[1] + 8) = *(undefined8 *)(base[2] + 8);
      *(undefined8 *)(base[2] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[3],*(char16_t **)base[2]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[2];
      pcVar7 = *(char16_t **)base[3];
      *(char16_t **)base[2] = pcVar7;
      *(undefined8 *)base[3] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[2];
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[2];
      pcVar7 = *(char16_t **)(base[2] + 8);
      *(char16_t **)base[2] = pcVar7;
      *(undefined8 *)(base[2] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[2];
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      pcVar7 = *(char16_t **)base[2];
      *(char16_t **)*base = pcVar7;
      *(undefined8 *)base[2] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*base;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)*pauVar10,pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)(base[1] + 8);
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)(base[2] + 8);
      *(undefined8 *)(base[2] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[3],*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      pcVar7 = *(char16_t **)base[3];
      *(char16_t **)base[1] = pcVar7;
      *(undefined8 *)base[3] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar13;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      *(undefined8 *)base[1] = *(undefined8 *)(base[2] + 8);
      *(undefined8 *)(base[2] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)(base[1] + 8);
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      pcVar7 = *(char16_t **)base[2];
      *(char16_t **)base[1] = pcVar7;
      *(undefined8 *)base[2] = uVar5;
      goto LAB_00366688;
    }
    goto LAB_00366685;
  case 8:
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),*(char16_t **)*base);
    if (iVar6 < 0) {
      auVar4 = *base;
      auVar25._0_8_ = auVar4._8_8_;
      auVar25._8_4_ = auVar4._0_4_;
      auVar25._12_4_ = auVar4._4_4_;
      *base = auVar25;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      pcVar7 = *(char16_t **)(base[1] + 8);
      *(char16_t **)base[1] = pcVar7;
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[1];
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)base[1];
      *(undefined8 *)base[1] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      pcVar7 = *(char16_t **)(base[1] + 8);
      *(char16_t **)(*base + 8) = pcVar7;
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)(*base + 8);
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[1],pcVar7);
    if (iVar6 < 0) {
      auVar4 = *(undefined1 (*) [16])(*base + 8);
      auVar30._0_8_ = auVar4._8_8_;
      auVar30._8_4_ = auVar4._0_4_;
      auVar30._12_4_ = auVar4._4_4_;
      *(undefined1 (*) [16])(*base + 8) = auVar30;
    }
    pauVar10 = base + 2;
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),*(char16_t **)base[2]);
    if (iVar6 < 0) {
      auVar4 = *pauVar10;
      auVar31._0_8_ = auVar4._8_8_;
      auVar31._8_4_ = auVar4._0_4_;
      auVar31._12_4_ = auVar4._4_4_;
      *pauVar10 = auVar31;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[3] + 8),*(char16_t **)base[3]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[3];
      pcVar7 = *(char16_t **)(base[3] + 8);
      *(char16_t **)base[3] = pcVar7;
      *(undefined8 *)(base[3] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[3];
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*pauVar10);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[2];
      *(undefined8 *)base[2] = *(undefined8 *)base[3];
      *(undefined8 *)base[3] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[3] + 8),*(char16_t **)(base[2] + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[2] + 8);
      pcVar7 = *(char16_t **)(base[3] + 8);
      *(char16_t **)(base[2] + 8) = pcVar7;
      *(undefined8 *)(base[3] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)(base[2] + 8);
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[3],pcVar7);
    if (iVar6 < 0) {
      auVar4 = *(undefined1 (*) [16])(base[2] + 8);
      auVar32._0_8_ = auVar4._8_8_;
      auVar32._8_4_ = auVar4._0_4_;
      auVar32._12_4_ = auVar4._4_4_;
      *(undefined1 (*) [16])(base[2] + 8) = auVar32;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)base[2];
      *(undefined8 *)base[2] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      pcVar7 = *(char16_t **)(base[2] + 8);
      *(char16_t **)(*base + 8) = pcVar7;
      *(undefined8 *)(base[2] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)(*base + 8);
    }
    iVar6 = PAL_wcscmp(*(char16_t **)*pauVar10,pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)base[2];
      *(undefined8 *)base[2] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[3],*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      *(undefined8 *)base[1] = *(undefined8 *)base[3];
      *(undefined8 *)base[3] = uVar5;
    }
    pauVar13 = (undefined1 (*) [16])(base[1] + 8);
    iVar6 = PAL_wcscmp(*(char16_t **)(base[3] + 8),*(char16_t **)(base[1] + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[1] + 8);
      pcVar7 = *(char16_t **)(base[3] + 8);
      *(char16_t **)(base[1] + 8) = pcVar7;
      *(undefined8 *)(base[3] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar13;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[3],pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[1] + 8);
      *(undefined8 *)(base[1] + 8) = *(undefined8 *)base[3];
      *(undefined8 *)base[3] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      *(undefined8 *)base[1] = *(undefined8 *)base[2];
      *(undefined8 *)base[2] = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),*(char16_t **)(base[1] + 8));
    if (-1 < iVar6) goto LAB_00366685;
    uVar5 = *(undefined8 *)(base[1] + 8);
    pcVar7 = *(char16_t **)(base[2] + 8);
    *(char16_t **)(base[1] + 8) = pcVar7;
    *(undefined8 *)(base[2] + 8) = uVar5;
    goto LAB_00366688;
  case 9:
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),*(char16_t **)*base);
    if (iVar6 < 0) {
      auVar4 = *base;
      auVar16._0_8_ = auVar4._8_8_;
      auVar16._8_4_ = auVar4._0_4_;
      auVar16._12_4_ = auVar4._4_4_;
      *base = auVar16;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)(base[1] + 8));
    if (iVar6 < 0) {
      auVar4 = *(undefined1 (*) [16])(base[1] + 8);
      auVar17._0_8_ = auVar4._8_8_;
      auVar17._8_4_ = auVar4._0_4_;
      auVar17._12_4_ = auVar4._4_4_;
      *(undefined1 (*) [16])(base[1] + 8) = auVar17;
    }
    pauVar10 = base + 3;
    iVar6 = PAL_wcscmp(*(char16_t **)(base[3] + 8),*(char16_t **)base[3]);
    if (iVar6 < 0) {
      auVar4 = *pauVar10;
      auVar18._0_8_ = auVar4._8_8_;
      auVar18._8_4_ = auVar4._0_4_;
      auVar18._12_4_ = auVar4._4_4_;
      *pauVar10 = auVar18;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[1],*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      auVar4 = *(undefined1 (*) [16])(*base + 8);
      auVar19._0_8_ = auVar4._8_8_;
      auVar19._8_4_ = auVar4._0_4_;
      auVar19._12_4_ = auVar4._4_4_;
      *(undefined1 (*) [16])(*base + 8) = auVar19;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),*(char16_t **)base[2]);
    if (iVar6 < 0) {
      auVar4 = base[2];
      auVar20._0_8_ = auVar4._8_8_;
      auVar20._8_4_ = auVar4._0_4_;
      auVar20._12_4_ = auVar4._4_4_;
      base[2] = auVar20;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[4],*(char16_t **)(base[3] + 8));
    if (iVar6 < 0) {
      auVar4 = *(undefined1 (*) [16])(base[3] + 8);
      auVar21._0_8_ = auVar4._8_8_;
      auVar21._8_4_ = auVar4._0_4_;
      auVar21._12_4_ = auVar4._4_4_;
      *(undefined1 (*) [16])(base[3] + 8) = auVar21;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(*base + 8),*(char16_t **)*base);
    if (iVar6 < 0) {
      auVar4 = *base;
      auVar22._0_8_ = auVar4._8_8_;
      auVar22._8_4_ = auVar4._0_4_;
      auVar22._12_4_ = auVar4._4_4_;
      *base = auVar22;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)(base[1] + 8));
    if (iVar6 < 0) {
      auVar4 = *(undefined1 (*) [16])(base[1] + 8);
      auVar23._0_8_ = auVar4._8_8_;
      auVar23._8_4_ = auVar4._0_4_;
      auVar23._12_4_ = auVar4._4_4_;
      *(undefined1 (*) [16])(base[1] + 8) = auVar23;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[3] + 8),*(char16_t **)base[3]);
    if (iVar6 < 0) {
      auVar4 = *pauVar10;
      auVar24._0_8_ = auVar4._8_8_;
      auVar24._8_4_ = auVar4._0_4_;
      auVar24._12_4_ = auVar4._4_4_;
      *pauVar10 = auVar24;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),*(char16_t **)*base);
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)*base;
      *(undefined8 *)*base = *(undefined8 *)(base[1] + 8);
      *(char16_t **)(base[1] + 8) = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)(base[1] + 8);
    }
    iVar6 = PAL_wcscmp(*(char16_t **)*pauVar10,pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[1] + 8);
      pcVar7 = *(char16_t **)base[3];
      *(char16_t **)(base[1] + 8) = pcVar7;
      *(undefined8 *)base[3] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)(base[1] + 8);
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)*base);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)*base;
      *(undefined8 *)*base = *(undefined8 *)(base[1] + 8);
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[2],*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)base[2];
      *(char16_t **)base[2] = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)base[2];
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[3] + 8),pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[2];
      pcVar7 = *(char16_t **)(base[3] + 8);
      *(char16_t **)base[2] = pcVar7;
      *(undefined8 *)(base[3] + 8) = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[2];
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)base[2];
      *(undefined8 *)base[2] = uVar5;
    }
    pauVar13 = (undefined1 (*) [16])(base[2] + 8);
    iVar6 = PAL_wcscmp(*(char16_t **)(base[2] + 8),*(char16_t **)base[1]);
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)base[1];
      *(undefined8 *)base[1] = *(undefined8 *)(base[2] + 8);
      *(char16_t **)(base[2] + 8) = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar13;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[4],pcVar7);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[2] + 8);
      pcVar7 = *(char16_t **)base[4];
      *(char16_t **)(base[2] + 8) = pcVar7;
      *(undefined8 *)base[4] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar13;
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      *(undefined8 *)base[1] = *(undefined8 *)(base[2] + 8);
      *(undefined8 *)(base[2] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),*(char16_t **)(*base + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(*base + 8);
      *(undefined8 *)(*base + 8) = *(undefined8 *)(base[1] + 8);
      *(undefined8 *)(base[1] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[3] + 8),*(char16_t **)(base[2] + 8));
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)(base[2] + 8);
      *(undefined8 *)(base[2] + 8) = *(undefined8 *)(base[3] + 8);
      *(undefined8 *)(base[3] + 8) = uVar5;
    }
    iVar6 = PAL_wcscmp(*(char16_t **)base[3],*(char16_t **)base[1]);
    if (iVar6 < 0) {
      pcVar7 = *(char16_t **)base[1];
      *(undefined8 *)base[1] = *(undefined8 *)base[3];
      *(char16_t **)base[3] = pcVar7;
    }
    else {
      pcVar7 = *(char16_t **)*pauVar10;
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)base[2]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[2];
      pcVar7 = *(char16_t **)base[3];
      *(char16_t **)base[2] = pcVar7;
      *(undefined8 *)base[3] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[2];
    }
    iVar6 = PAL_wcscmp(pcVar7,*(char16_t **)base[1]);
    if (iVar6 < 0) {
      uVar5 = *(undefined8 *)base[1];
      pcVar7 = *(char16_t **)base[2];
      *(char16_t **)base[1] = pcVar7;
      *(undefined8 *)base[2] = uVar5;
    }
    else {
      pcVar7 = *(char16_t **)base[1];
    }
    iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),pcVar7);
    if (iVar6 < 0) {
      auVar4 = base[1];
      auVar27._0_8_ = auVar4._8_8_;
      auVar27._8_4_ = auVar4._0_4_;
      auVar27._12_4_ = auVar4._4_4_;
      base[1] = auVar27;
    }
LAB_00366246:
    string1 = *(char16_t **)*pauVar10;
LAB_00366249:
    pcVar7 = *(char16_t **)*pauVar13;
    base = pauVar13;
    goto LAB_0036668b;
  default:
    return;
  }
  pauVar13 = (undefined1 (*) [16])(*base + 8);
  pauVar10 = base + 1;
  iVar6 = PAL_wcscmp(*(char16_t **)(base[1] + 8),pcVar7);
  if (iVar6 < 0) {
    uVar5 = *(undefined8 *)(*base + 8);
    pcVar7 = *(char16_t **)(base[1] + 8);
    *(char16_t **)(*base + 8) = pcVar7;
    *(undefined8 *)(base[1] + 8) = uVar5;
  }
  else {
LAB_00366685:
    pcVar7 = *(char16_t **)*pauVar13;
  }
LAB_00366688:
  string1 = *(char16_t **)*pauVar10;
  base = pauVar13;
LAB_0036668b:
  iVar6 = PAL_wcscmp(string1,pcVar7);
LAB_00366690:
  if (-1 < iVar6) {
    return;
  }
LAB_00366694:
  uVar5 = *(undefined8 *)*base;
  *(undefined8 *)*base = *(undefined8 *)*pauVar10;
  *(undefined8 *)*pauVar10 = uVar5;
  return;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }